

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void btreeLeaveAll(sqlite3 *db)

{
  Btree *p;
  long lVar1;
  int i;
  long lVar2;
  
  lVar1 = 8;
  for (lVar2 = 0; lVar2 < db->nDb; lVar2 = lVar2 + 1) {
    p = *(Btree **)((long)&db->aDb->zDbSName + lVar1);
    if (p != (Btree *)0x0) {
      sqlite3BtreeLeave(p);
    }
    lVar1 = lVar1 + 0x20;
  }
  return;
}

Assistant:

static void SQLITE_NOINLINE btreeLeaveAll(sqlite3 *db){
  int i;
  Btree *p;
  assert( sqlite3_mutex_held(db->mutex) );
  for(i=0; i<db->nDb; i++){
    p = db->aDb[i].pBt;
    if( p ) sqlite3BtreeLeave(p);
  }
}